

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

char * __thiscall
cmCommandArgumentParserHelper::ExpandSpecialVariable
          (cmCommandArgumentParserHelper *this,char *key,char *var)

{
  int iVar1;
  cmCommandArgumentParserHelper *pcVar2;
  cmState *this_00;
  char *pcVar3;
  ostream *poVar4;
  string local_2c0;
  ostringstream local_2a0 [8];
  ostringstream e;
  allocator local_121;
  string local_120;
  allocator local_f9;
  string local_f8;
  string local_d8;
  allocator local_b1;
  string local_b0;
  char *local_90;
  char *c;
  allocator local_71;
  string local_70;
  string local_50;
  cmCommandArgumentParserHelper *local_30;
  char *ptr;
  char *var_local;
  char *key_local;
  cmCommandArgumentParserHelper *this_local;
  
  ptr = var;
  var_local = key;
  key_local = this->EmptyVariable;
  if (key == (char *)0x0) {
    this_local = (cmCommandArgumentParserHelper *)ExpandVariable(this,var);
  }
  else {
    this_local = this;
    if (var != (char *)0x0) {
      iVar1 = strcmp(key,"ENV");
      if (iVar1 == 0) {
        pcVar2 = (cmCommandArgumentParserHelper *)getenv(ptr);
        this_local = this;
        if ((pcVar2 != (cmCommandArgumentParserHelper *)0x0) &&
           (this_local = pcVar2, (this->EscapeQuotes & 1U) != 0)) {
          local_30 = pcVar2;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_70,(char *)pcVar2,&local_71);
          cmSystemTools::EscapeQuotes(&local_50,&local_70);
          this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          std::allocator<char>::~allocator((allocator<char> *)&local_71);
        }
      }
      else {
        iVar1 = strcmp(var_local,"CACHE");
        if (iVar1 == 0) {
          this_00 = cmMakefile::GetState(this->Makefile);
          pcVar3 = ptr;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_b0,pcVar3,&local_b1);
          pcVar3 = cmState::GetInitializedCacheValue(this_00,&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_b1);
          this_local = this;
          if (pcVar3 != (char *)0x0) {
            local_90 = pcVar3;
            if ((this->EscapeQuotes & 1U) == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_120,pcVar3,&local_121);
              this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_120);
              std::__cxx11::string::~string((string *)&local_120);
              std::allocator<char>::~allocator((allocator<char> *)&local_121);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_f8,pcVar3,&local_f9);
              cmSystemTools::EscapeQuotes(&local_d8,&local_f8);
              this_local = (cmCommandArgumentParserHelper *)AddString(this,&local_d8);
              std::__cxx11::string::~string((string *)&local_d8);
              std::__cxx11::string::~string((string *)&local_f8);
              std::allocator<char>::~allocator((allocator<char> *)&local_f9);
            }
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_2a0);
          poVar4 = std::operator<<((ostream *)local_2a0,"Syntax $");
          poVar4 = std::operator<<(poVar4,var_local);
          poVar4 = std::operator<<(poVar4,"{} is not supported.  ");
          std::operator<<(poVar4,"Only ${}, $ENV{}, and $CACHE{} are allowed.");
          std::__cxx11::ostringstream::str();
          SetError(this,&local_2c0);
          std::__cxx11::string::~string((string *)&local_2c0);
          this_local = (cmCommandArgumentParserHelper *)0x0;
          std::__cxx11::ostringstream::~ostringstream(local_2a0);
        }
      }
    }
  }
  return this_local->EmptyVariable;
}

Assistant:

char* cmCommandArgumentParserHelper::ExpandSpecialVariable(const char* key,
                                                           const char* var)
{
  if ( !key )
    {
    return this->ExpandVariable(var);
    }
  if(!var)
    {
    return this->EmptyVariable;
    }
  if ( strcmp(key, "ENV") == 0 )
    {
    char *ptr = getenv(var);
    if (ptr)
      {
      if (this->EscapeQuotes)
        {
        return this->AddString(cmSystemTools::EscapeQuotes(ptr));
        }
      else
        {
        return ptr;
        }
      }
    return this->EmptyVariable;
    }
  if ( strcmp(key, "CACHE") == 0 )
    {
    if(const char* c = this->Makefile->GetState()
                           ->GetInitializedCacheValue(var))
      {
      if(this->EscapeQuotes)
        {
        return this->AddString(cmSystemTools::EscapeQuotes(c));
        }
      else
        {
        return this->AddString(c);
        }
      }
    return this->EmptyVariable;
    }
  std::ostringstream e;
  e << "Syntax $" << key << "{} is not supported.  "
    << "Only ${}, $ENV{}, and $CACHE{} are allowed.";
  this->SetError(e.str());
  return 0;
}